

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLRootParser15.cpp
# Opt level: O0

LibraryKinematicsModelsLoader * __thiscall
COLLADASaxFWL::RootParser15::
beginCommonWithId<COLLADASaxFWL::LibraryKinematicsModelsLoader,COLLADASaxFWL::LibraryKinematicsModelsLoader15>
          (RootParser15 *this,char *id)

{
  LibraryKinematicsModelsLoader *callingFilePartLoader;
  IParserImpl *parserImpl;
  long in_RDI;
  LibraryKinematicsModelsLoader15 *loader15;
  LibraryKinematicsModelsLoader *loader;
  IFilePartLoader *in_stack_ffffffffffffffa0;
  LibraryKinematicsModelsLoader *in_stack_ffffffffffffffa8;
  LibraryKinematicsModelsLoader15 *in_stack_ffffffffffffffb0;
  IParserImpl *pIVar1;
  LibraryKinematicsModelsLoader *in_stack_ffffffffffffffd0;
  
  IFilePartLoader::deleteFilePartLoader(in_stack_ffffffffffffffa0);
  callingFilePartLoader = (LibraryKinematicsModelsLoader *)operator_new(0x210);
  LibraryKinematicsModelsLoader::LibraryKinematicsModelsLoader
            (in_stack_ffffffffffffffd0,(IFilePartLoader *)callingFilePartLoader);
  parserImpl = (IParserImpl *)operator_new(0x28);
  LibraryKinematicsModelsLoader15::LibraryKinematicsModelsLoader15
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  IFilePartLoader::setParserImpl((IFilePartLoader *)callingFilePartLoader,parserImpl);
  IFilePartLoader::setPartLoader
            (*(IFilePartLoader **)(in_RDI + 0x20),(IFilePartLoader *)callingFilePartLoader);
  pIVar1 = (IParserImpl *)0x0;
  if (parserImpl != (IParserImpl *)0x0) {
    pIVar1 = parserImpl + 1;
  }
  (**(code **)(**(long **)(in_RDI + 0x20) + 0x50))(*(long **)(in_RDI + 0x20),pIVar1);
  DocumentProcessor::addToSidTree((DocumentProcessor *)this,id,(char *)loader);
  return callingFilePartLoader;
}

Assistant:

Loader* RootParser15::beginCommonWithId( const char * id)
	{
		mFileLoader->deleteFilePartLoader();
		Loader* loader = new Loader(mFileLoader);
		Loader15* loader15 = new Loader15(loader);
		loader->setParserImpl( loader15 );
		mFileLoader->setPartLoader(loader);
		mFileLoader->setParser(loader15);
		mFileLoader->addToSidTree( id, 0);
		return loader;
	}